

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test::
testBody(TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
         *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  MockSupport *pMVar4;
  undefined4 extraout_var;
  MockExpectedCall *pMVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  MockActualCall *pMVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  UtestShell *pUVar7;
  char *pcVar8;
  undefined4 extraout_var_06;
  char *pcVar9;
  TestTerminator *pTVar10;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  SimpleString local_808;
  MockNamedValue local_7f8;
  SimpleString local_7a8;
  SimpleString local_798;
  SimpleString local_788;
  MockNamedValue local_778;
  SimpleString local_728;
  MockNamedValue local_718;
  SimpleString local_6c8;
  MockNamedValue local_6b8;
  SimpleString local_668;
  SimpleString local_658;
  SimpleString local_648;
  MockNamedValue local_638;
  SimpleString local_5e8;
  SimpleString local_5d8;
  SimpleString local_5c8;
  SimpleString local_5b8;
  SimpleString local_5a8;
  MockNamedValue local_598;
  SimpleString local_548;
  SimpleString local_538;
  SimpleString local_528;
  MockNamedValue local_518;
  SimpleString local_4c8;
  SimpleString local_4b8;
  SimpleString local_4a8;
  MockNamedValue local_498;
  SimpleString local_448;
  MockNamedValue local_438;
  SimpleString local_3e8;
  SimpleString local_3d8;
  SimpleString local_3c8;
  MockNamedValue local_3b8;
  SimpleString local_368;
  MockNamedValue local_358;
  SimpleString local_308;
  MockNamedValue local_2f8;
  SimpleString local_2a8;
  SimpleString local_298;
  SimpleString local_288;
  MockNamedValue local_278;
  SimpleString local_228;
  SimpleString local_218;
  SimpleString local_208;
  SimpleString local_1f8;
  SimpleString local_1e8;
  MockNamedValue local_1d8;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  MockNamedValue local_158;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  MockNamedValue local_d8;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  byte local_12;
  byte local_11;
  bool another_ret_value;
  TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
  *pTStack_10;
  bool ret_value;
  TEST_MockReturnValueTest_BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
  *this_local;
  
  local_11 = 1;
  local_12 = 0;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar4 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,local_48);
  SimpleString::SimpleString(&local_58,"p1");
  pMVar5 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar3),&local_58,1);
  iVar3 = (*pMVar5->_vptr_MockExpectedCall[9])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0xc0))
            ((long *)CONCAT44(extraout_var_00,iVar3),local_11 & 1);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_68,"");
  pMVar4 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[3])(pMVar4,&local_78);
  SimpleString::SimpleString(&local_88,"p1");
  pMVar5 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_01,iVar3),&local_88,1);
  iVar3 = (*pMVar5->_vptr_MockExpectedCall[9])();
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xc0))
            ((long *)CONCAT44(extraout_var_02,iVar3),local_12 & 1);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  bVar2 = (bool)(local_11 & 1);
  SimpleString::SimpleString(&local_e8,"");
  pMVar4 = mock(&local_e8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f8,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_f8);
  SimpleString::SimpleString(&local_108,"p1");
  pMVar6 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_03,iVar3),&local_108,1);
  (*pMVar6->_vptr_MockActualCall[0x15])(&local_d8);
  bVar1 = MockNamedValue::getBoolValue(&local_d8);
  MockNamedValue::~MockNamedValue(&local_d8);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::~SimpleString(&local_e8);
  if (bVar2 == bVar1) {
    pUVar7 = UtestShell::getCurrent();
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0xe])
              (pUVar7,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18a,pTVar10);
  }
  else {
    SimpleString::SimpleString(&local_168,"");
    pMVar4 = mock(&local_168,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_178,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_178);
    SimpleString::SimpleString(&local_188,"p1");
    pMVar6 = MockActualCall::withParameter
                       ((MockActualCall *)CONCAT44(extraout_var_04,iVar3),&local_188,1);
    (*pMVar6->_vptr_MockActualCall[0x15])(&local_158);
    bVar2 = MockNamedValue::getBoolValue(&local_158);
    SimpleString::SimpleString(&local_1e8,"");
    pMVar4 = mock(&local_1e8,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_1f8,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_1f8);
    SimpleString::SimpleString(&local_208,"p1");
    pMVar6 = MockActualCall::withParameter
                       ((MockActualCall *)CONCAT44(extraout_var_05,iVar3),&local_208,1);
    (*pMVar6->_vptr_MockActualCall[0x15])(&local_1d8);
    bVar1 = MockNamedValue::getBoolValue(&local_1d8);
    MockNamedValue::~MockNamedValue(&local_1d8);
    SimpleString::~SimpleString(&local_208);
    SimpleString::~SimpleString(&local_1f8);
    SimpleString::~SimpleString(&local_1e8);
    MockNamedValue::~MockNamedValue(&local_158);
    SimpleString::~SimpleString(&local_188);
    SimpleString::~SimpleString(&local_178);
    SimpleString::~SimpleString(&local_168);
    if (bVar2 != bVar1) {
      pUVar7 = UtestShell::getCurrent();
      (*pUVar7->_vptr_UtestShell[0x1c])
                (pUVar7,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18a);
    }
    pUVar7 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_218,0));
    pcVar8 = SimpleString::asCharString(&local_218);
    SimpleString::SimpleString(&local_288,"");
    pMVar4 = mock(&local_288,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_298,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_298);
    SimpleString::SimpleString(&local_2a8,"p1");
    pMVar6 = MockActualCall::withParameter
                       ((MockActualCall *)CONCAT44(extraout_var_06,iVar3),&local_2a8,1);
    (*pMVar6->_vptr_MockActualCall[0x15])(&local_278);
    MockNamedValue::getBoolValue(&local_278);
    ::StringFrom(SUB81(&local_228,0));
    pcVar9 = SimpleString::asCharString(&local_228);
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0x16])
              (pUVar7,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18a,pTVar10);
    SimpleString::~SimpleString(&local_228);
    MockNamedValue::~MockNamedValue(&local_278);
    SimpleString::~SimpleString(&local_2a8);
    SimpleString::~SimpleString(&local_298);
    SimpleString::~SimpleString(&local_288);
    SimpleString::~SimpleString(&local_218);
  }
  bVar2 = (bool)(local_11 & 1);
  SimpleString::SimpleString(&local_308,"");
  pMVar4 = mock(&local_308,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_2f8);
  bVar1 = MockNamedValue::getBoolValue(&local_2f8);
  MockNamedValue::~MockNamedValue(&local_2f8);
  SimpleString::~SimpleString(&local_308);
  if (bVar2 == bVar1) {
    pUVar7 = UtestShell::getCurrent();
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0xe])
              (pUVar7,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18b,pTVar10);
  }
  else {
    SimpleString::SimpleString(&local_368,"");
    pMVar4 = mock(&local_368,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_358);
    bVar2 = MockNamedValue::getBoolValue(&local_358);
    SimpleString::SimpleString(&local_3c8,"");
    pMVar4 = mock(&local_3c8,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_3b8);
    bVar1 = MockNamedValue::getBoolValue(&local_3b8);
    MockNamedValue::~MockNamedValue(&local_3b8);
    SimpleString::~SimpleString(&local_3c8);
    MockNamedValue::~MockNamedValue(&local_358);
    SimpleString::~SimpleString(&local_368);
    if (bVar2 != bVar1) {
      pUVar7 = UtestShell::getCurrent();
      (*pUVar7->_vptr_UtestShell[0x1c])
                (pUVar7,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18b);
    }
    pUVar7 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_3d8,0));
    pcVar8 = SimpleString::asCharString(&local_3d8);
    SimpleString::SimpleString(&local_448,"");
    pMVar4 = mock(&local_448,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_438);
    MockNamedValue::getBoolValue(&local_438);
    ::StringFrom(SUB81(&local_3e8,0));
    pcVar9 = SimpleString::asCharString(&local_3e8);
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0x16])
              (pUVar7,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18b,pTVar10);
    SimpleString::~SimpleString(&local_3e8);
    MockNamedValue::~MockNamedValue(&local_438);
    SimpleString::~SimpleString(&local_448);
    SimpleString::~SimpleString(&local_3d8);
  }
  bVar2 = (bool)(local_12 & 1);
  SimpleString::SimpleString(&local_4a8,"");
  pMVar4 = mock(&local_4a8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_4b8,"foo");
  iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_4b8);
  SimpleString::SimpleString(&local_4c8,"p1");
  pMVar6 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_07,iVar3),&local_4c8,1);
  (*pMVar6->_vptr_MockActualCall[0x15])(&local_498);
  bVar1 = MockNamedValue::getBoolValue(&local_498);
  MockNamedValue::~MockNamedValue(&local_498);
  SimpleString::~SimpleString(&local_4c8);
  SimpleString::~SimpleString(&local_4b8);
  SimpleString::~SimpleString(&local_4a8);
  if (bVar2 == bVar1) {
    pUVar7 = UtestShell::getCurrent();
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0xe])
              (pUVar7,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18c,pTVar10);
  }
  else {
    SimpleString::SimpleString(&local_528,"");
    pMVar4 = mock(&local_528,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_538,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_538);
    SimpleString::SimpleString(&local_548,"p1");
    pMVar6 = MockActualCall::withParameter
                       ((MockActualCall *)CONCAT44(extraout_var_08,iVar3),&local_548,1);
    (*pMVar6->_vptr_MockActualCall[0x15])(&local_518);
    bVar2 = MockNamedValue::getBoolValue(&local_518);
    SimpleString::SimpleString(&local_5a8,"");
    pMVar4 = mock(&local_5a8,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_5b8,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_5b8);
    SimpleString::SimpleString(&local_5c8,"p1");
    pMVar6 = MockActualCall::withParameter
                       ((MockActualCall *)CONCAT44(extraout_var_09,iVar3),&local_5c8,1);
    (*pMVar6->_vptr_MockActualCall[0x15])(&local_598);
    bVar1 = MockNamedValue::getBoolValue(&local_598);
    MockNamedValue::~MockNamedValue(&local_598);
    SimpleString::~SimpleString(&local_5c8);
    SimpleString::~SimpleString(&local_5b8);
    SimpleString::~SimpleString(&local_5a8);
    MockNamedValue::~MockNamedValue(&local_518);
    SimpleString::~SimpleString(&local_548);
    SimpleString::~SimpleString(&local_538);
    SimpleString::~SimpleString(&local_528);
    if (bVar2 != bVar1) {
      pUVar7 = UtestShell::getCurrent();
      (*pUVar7->_vptr_UtestShell[0x1c])
                (pUVar7,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18c);
    }
    pUVar7 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_5d8,0));
    pcVar8 = SimpleString::asCharString(&local_5d8);
    SimpleString::SimpleString(&local_648,"");
    pMVar4 = mock(&local_648,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_658,"foo");
    iVar3 = (*pMVar4->_vptr_MockSupport[6])(pMVar4,&local_658);
    SimpleString::SimpleString(&local_668,"p1");
    pMVar6 = MockActualCall::withParameter
                       ((MockActualCall *)CONCAT44(extraout_var_10,iVar3),&local_668,1);
    (*pMVar6->_vptr_MockActualCall[0x15])(&local_638);
    MockNamedValue::getBoolValue(&local_638);
    ::StringFrom(SUB81(&local_5e8,0));
    pcVar9 = SimpleString::asCharString(&local_5e8);
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0x16])
              (pUVar7,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18c,pTVar10);
    SimpleString::~SimpleString(&local_5e8);
    MockNamedValue::~MockNamedValue(&local_638);
    SimpleString::~SimpleString(&local_668);
    SimpleString::~SimpleString(&local_658);
    SimpleString::~SimpleString(&local_648);
    SimpleString::~SimpleString(&local_5d8);
  }
  bVar2 = (bool)(local_12 & 1);
  SimpleString::SimpleString(&local_6c8,"");
  pMVar4 = mock(&local_6c8,(MockFailureReporter *)0x0);
  (*pMVar4->_vptr_MockSupport[8])(&local_6b8);
  bVar1 = MockNamedValue::getBoolValue(&local_6b8);
  MockNamedValue::~MockNamedValue(&local_6b8);
  SimpleString::~SimpleString(&local_6c8);
  if (bVar2 == bVar1) {
    pUVar7 = UtestShell::getCurrent();
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0xe])
              (pUVar7,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18d,pTVar10);
  }
  else {
    SimpleString::SimpleString(&local_728,"");
    pMVar4 = mock(&local_728,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_718);
    bVar2 = MockNamedValue::getBoolValue(&local_718);
    SimpleString::SimpleString(&local_788,"");
    pMVar4 = mock(&local_788,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_778);
    bVar1 = MockNamedValue::getBoolValue(&local_778);
    MockNamedValue::~MockNamedValue(&local_778);
    SimpleString::~SimpleString(&local_788);
    MockNamedValue::~MockNamedValue(&local_718);
    SimpleString::~SimpleString(&local_728);
    if (bVar2 != bVar1) {
      pUVar7 = UtestShell::getCurrent();
      (*pUVar7->_vptr_UtestShell[0x1c])
                (pUVar7,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                 ,0x18d);
    }
    pUVar7 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_798,0));
    pcVar8 = SimpleString::asCharString(&local_798);
    SimpleString::SimpleString(&local_808,"");
    pMVar4 = mock(&local_808,(MockFailureReporter *)0x0);
    (*pMVar4->_vptr_MockSupport[8])(&local_7f8);
    MockNamedValue::getBoolValue(&local_7f8);
    ::StringFrom(SUB81(&local_7a8,0));
    pcVar9 = SimpleString::asCharString(&local_7a8);
    pTVar10 = UtestShell::getCurrentTestTerminator();
    (*pUVar7->_vptr_UtestShell[0x16])
              (pUVar7,1,pcVar8,pcVar9,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
               ,0x18d,pTVar10);
    SimpleString::~SimpleString(&local_7a8);
    MockNamedValue::~MockNamedValue(&local_7f8);
    SimpleString::~SimpleString(&local_808);
    SimpleString::~SimpleString(&local_798);
  }
  return;
}

Assistant:

TEST(MockReturnValueTest, BooleanReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    bool ret_value = true;
    bool another_ret_value = false;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    CHECK_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getBoolValue());
    CHECK_EQUAL(ret_value, mock().returnValue().getBoolValue());
    CHECK_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getBoolValue());
    CHECK_EQUAL(another_ret_value, mock().returnValue().getBoolValue());
}